

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboTestUtil::Texture3DShader::shadeFragments
          (Texture3DShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  float *pfVar1;
  deInt32 dVar2;
  DataType DVar3;
  pointer pUVar4;
  GenericVec4 *pGVar5;
  Texture3DShader *pTVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  deInt32 *pdVar10;
  int fragNdx;
  long lVar11;
  FragmentPacket *packet;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vec4 coord;
  UVec4 uicolor;
  IVec4 icolor;
  Vec3 texCoords [4];
  Vec4 colors [4];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  ulong local_110;
  Texture3DShader *local_108;
  FragmentPacket *local_100;
  Texture3D *local_f8;
  ulong local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vec4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pUVar4 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_d8 = *(undefined8 *)&pUVar4[1].value;
  uStack_d0 = *(undefined8 *)((long)&pUVar4[1].value + 8);
  local_e8 = *(undefined8 *)&pUVar4[2].value;
  uStack_e0 = *(undefined8 *)((long)&pUVar4[2].value + 8);
  dVar2 = pUVar4[3].value.i;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8._0_4_ = 0.0;
  local_a8._4_4_ = 0.0;
  local_a8._8_8_ = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 0.0;
  if (0 < numPackets) {
    local_110 = (ulong)(uint)numPackets;
    iVar7 = 0;
    local_f0 = 0;
    local_108 = this;
    local_100 = packets;
    do {
      pTVar6 = local_108;
      local_f8 = (((local_108->super_ShaderProgram).m_uniforms.
                   super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl
                   .super__Vector_impl_data._M_start)->sampler).tex3D;
      packet = local_100 + local_f0;
      pdVar10 = (deInt32 *)(local_a8 + 8);
      lVar11 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_128,packet,context,0,(int)lVar11);
        *(ulong *)(pdVar10 + -2) = CONCAT44(fStack_124,local_128);
        *pdVar10 = dVar2;
        lVar11 = lVar11 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar11 != 4);
      sglr::rc::Texture3D::sample4(local_f8,&local_78,(Vec3 *)local_a8,0.0);
      DVar3 = pTVar6->m_outputType;
      pGVar5 = context->outputArray;
      lVar11 = 0;
      iVar9 = iVar7;
      do {
        local_128 = *(float *)((long)local_78.m_data + lVar11) * (float)local_d8 + (float)local_e8;
        fStack_124 = *(float *)((long)local_78.m_data + lVar11 + 4) * local_d8._4_4_ +
                     local_e8._4_4_;
        fStack_120 = *(float *)((long)local_78.m_data + lVar11 + 8) * (float)uStack_d0 +
                     (float)uStack_e0;
        fStack_11c = *(float *)((long)local_78.m_data + lVar11 + 0xc) * uStack_d0._4_4_ +
                     uStack_e0._4_4_;
        castVectorSaturate<int>((Vec4 *)&local_128);
        castVectorSaturate<unsigned_int>((Vec4 *)&local_128);
        if (DVar3 == TYPE_UINT_VEC4) {
          lVar8 = (long)(context->numFragmentOutputs * iVar9) << 4;
          fVar12 = local_c8;
          fVar13 = fStack_c4;
          fVar14 = fStack_c0;
          fVar15 = fStack_bc;
LAB_0069f403:
          pfVar1 = (float *)((long)&pGVar5->v + lVar8);
          *pfVar1 = fVar12;
          pfVar1[1] = fVar13;
          pfVar1[2] = fVar14;
          pfVar1[3] = fVar15;
        }
        else {
          if (DVar3 == TYPE_INT_VEC4) {
            lVar8 = (long)(context->numFragmentOutputs * iVar9) << 4;
            fVar12 = local_b8;
            fVar13 = fStack_b4;
            fVar14 = fStack_b0;
            fVar15 = fStack_ac;
            goto LAB_0069f403;
          }
          if (DVar3 == TYPE_FLOAT_VEC4) {
            lVar8 = (long)(context->numFragmentOutputs * iVar9) << 4;
            fVar12 = local_128;
            fVar13 = fStack_124;
            fVar14 = fStack_120;
            fVar15 = fStack_11c;
            goto LAB_0069f403;
          }
        }
        lVar11 = lVar11 + 0x10;
        iVar9 = iVar9 + 1;
      } while (lVar11 != 0x40);
      local_f0 = local_f0 + 1;
      iVar7 = iVar7 + 4;
    } while (local_f0 != local_110);
  }
  return;
}

Assistant:

void Texture3DShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 texScale	(m_uniforms[1].value.f4);
	const tcu::Vec4 texBias		(m_uniforms[2].value.f4);
	const float		depth		= m_uniforms[3].value.f;

	tcu::Vec3 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const sglr::rc::Texture3D* tex = m_uniforms[0].sampler.tex3D;

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec3(coord.x(), coord.y(), depth);
		}

		tex->sample4(colors, texCoords);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * texScale + texBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}